

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O3

TPZAutoPointer<TPZStructMatrix> * __thiscall
TPZAutoPointer<TPZStructMatrix>::operator=
          (TPZAutoPointer<TPZStructMatrix> *this,TPZStructMatrix *rval)

{
  bool bVar1;
  TPZReference *pTVar2;
  
  if (this->fRef != (TPZReference *)0x0) {
    bVar1 = TPZReference::Decrease(this->fRef);
    if (bVar1) {
      if ((this->fRef != (TPZReference *)0x0) &&
         ((this->fRef->fCounter).super___atomic_base<int>._M_i == 0)) {
        pTVar2 = this->fRef;
        if ((pTVar2 != (TPZReference *)0x0) && (pTVar2->fPointer != (TPZStructMatrix *)0x0)) {
          (**(code **)(*(long *)pTVar2->fPointer + 8))();
        }
        operator_delete(pTVar2,0x10);
      }
      this->fRef = (TPZReference *)0x0;
    }
  }
  pTVar2 = (TPZReference *)operator_new(0x10);
  (pTVar2->fCounter).super___atomic_base<int>._M_i = 0;
  pTVar2->fPointer = rval;
  LOCK();
  (pTVar2->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  this->fRef = pTVar2;
  return this;
}

Assistant:

TPZAutoPointer &operator=(T *rval)
    {
        if (fRef && fRef->Decrease()){
            Release();
        }
        fRef = new TPZReference(rval);
        return *this;
    }